

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

RemoteProducer * __thiscall
perfetto::ProducerIPCService::GetProducerForCurrentRequest(ProducerIPCService *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ClientInfo *this_00;
  char *fname;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  pointer ppVar7;
  _Self local_30;
  _Self local_28;
  iterator it;
  ClientID ipc_client_id;
  ProducerIPCService *this_local;
  
  this_00 = ipc::Service::client_info((Service *)this);
  it._M_node = (_Base_ptr)ipc::ClientInfo::client_id(this_00);
  if (it._M_node != (_Base_ptr)0x0) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,_std::default_delete<perfetto::ProducerIPCService::RemoteProducer>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,_std::default_delete<perfetto::ProducerIPCService::RemoteProducer>_>_>_>_>
         ::find(&this->producers_,(key_type *)&it);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,_std::default_delete<perfetto::ProducerIPCService::RemoteProducer>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,_std::default_delete<perfetto::ProducerIPCService::RemoteProducer>_>_>_>_>
         ::end(&this->producers_);
    bVar3 = std::operator==(&local_28,&local_30);
    if (bVar3) {
      this_local = (ProducerIPCService *)0x0;
    }
    else {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,_std::default_delete<perfetto::ProducerIPCService::RemoteProducer>_>_>_>
               ::operator->(&local_28);
      this_local = (ProducerIPCService *)
                   std::
                   unique_ptr<perfetto::ProducerIPCService::RemoteProducer,_std::default_delete<perfetto::ProducerIPCService::RemoteProducer>_>
                   ::get(&ppVar7->second);
    }
    return (RemoteProducer *)this_local;
  }
  fname = perfetto::base::Basename
                    (
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  perfetto::base::LogMessage
            (kLogError,fname,0x12126,"%s (errno: %d, %s)","PERFETTO_CHECK(ipc_client_id)",
             (ulong)uVar1,pcVar6);
  perfetto::base::MaybeSerializeLastLogsForCrashReporting();
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

ProducerIPCService::RemoteProducer*
ProducerIPCService::GetProducerForCurrentRequest() {
  const ipc::ClientID ipc_client_id = ipc::Service::client_info().client_id();
  PERFETTO_CHECK(ipc_client_id);
  auto it = producers_.find(ipc_client_id);
  if (it == producers_.end())
    return nullptr;
  return it->second.get();
}